

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

gravity_value_t convert_list2string(gravity_vm *vm,gravity_list_t *list)

{
  gravity_value_t *pgVar1;
  gravity_class_t *pgVar2;
  char *s;
  ulong uVar3;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  char *__src;
  uint uVar10;
  gravity_value_t gVar11;
  uint local_54;
  
  uVar6 = 1;
  s = (char *)gravity_calloc((gravity_vm *)0x0,1,0x201);
  *s = '[';
  uVar3 = (ulong)(uint)(list->array).n;
  if (uVar3 == 0) {
    uVar9 = 1;
  }
  else {
    uVar8 = 1;
    local_54 = 0x200;
    lVar5 = 0;
    do {
      pgVar1 = (list->array).p;
      pgVar2 = *(gravity_class_t **)((long)&pgVar1->isa + lVar5);
      aVar4 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
              ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)&pgVar1->field_1 + lVar5))->n
      ;
      if ((pgVar2 == gravity_class_list) && ((gravity_list_t *)aVar4.n == list)) {
        aVar4.n = 0;
      }
      else {
        gVar11.field_1.n = aVar4.n;
        gVar11.isa = pgVar2;
        gVar11 = convert_value2string(vm,gVar11);
        aVar4 = gVar11.field_1;
        if (gVar11.isa == (gravity_class_t *)0x0) {
          aVar4.n = 0;
        }
      }
      __src = "N/A";
      if (aVar4.n == 0) {
        uVar10 = 3;
      }
      else {
        __src = (char *)(aVar4.p)->objclass;
        uVar10 = *(uint *)((long)&(aVar4.p)->identifier + 4);
      }
      uVar7 = uVar10 + uVar8 + 2;
      if (local_54 < uVar7) {
        local_54 = uVar7 + local_54;
        s = (char *)gravity_realloc((gravity_vm *)0x0,s,(ulong)local_54);
      }
      uVar9 = (ulong)(uVar10 + uVar8);
      memcpy(s + uVar8,__src,(ulong)uVar10);
      if (uVar6 < uVar3) {
        s[uVar9] = ',';
        uVar9 = (ulong)(uVar10 + uVar8 + 1);
      }
      lVar5 = lVar5 + 0x10;
      uVar6 = uVar6 + 1;
      uVar8 = (uint)uVar9;
    } while (uVar3 << 4 != lVar5);
  }
  s[uVar9] = ']';
  uVar8 = (int)uVar9 + 1;
  s[uVar8] = '\0';
  gVar11 = gravity_string_to_value(vm,s,uVar8);
  free(s);
  return gVar11;
}

Assistant:

static inline gravity_value_t convert_list2string (gravity_vm *vm, gravity_list_t *list) {
    // allocate initial memory to a 512 buffer
    uint32_t len = 512;
    char *buffer = mem_alloc(NULL, len+1);
    buffer[0] = '[';
    uint32_t pos = 1;

    // loop to perform string concat
    uint32_t count = (uint32_t) marray_size(list->array);
    for (uint32_t i=0; i<count; ++i) {
        gravity_value_t value = marray_get(list->array, i);
        gravity_string_t *string;
        if (VALUE_ISA_LIST(value) && (VALUE_AS_LIST(value) == list)) {
            string = NULL;
        } else {
            gravity_value_t value2 = convert_value2string(vm, value);
            string = VALUE_ISA_VALID(value2) ? VALUE_AS_STRING(value2) : NULL;
        }

        char *s1 = (string) ? string->s : "N/A";
        uint32_t len1 = (string) ? string->len : 3;

        // check if buffer needs to be reallocated
        if (len1+pos+2 > len) {
            len = (len1+pos+2) + len;
            buffer = mem_realloc(NULL, buffer, len);
        }

        // copy string to new buffer
        memcpy(buffer+pos, s1, len1);
        pos += len1;

        // add separator
        if (i+1 < count) {
            memcpy(buffer+pos, ",", 1);
            pos += 1;
        }
    }

    // Write latest ] character
    memcpy(buffer+pos, "]", 1);
    buffer[++pos] = 0;

    gravity_value_t result = VALUE_FROM_STRING(vm, buffer, pos);
    mem_free(buffer);
    return result;
}